

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O2

Segment * __thiscall
gepard::Segment::splitSegment(Segment *__return_storage_ptr__,Segment *this,Float y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint __line;
  char *__assertion;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  FloatPoint to;
  FloatPoint from;
  FloatPoint local_30;
  
  dVar7 = (this->from).y;
  dVar1 = (this->to).y;
  if (dVar1 <= dVar7) {
    __assertion = "this->from.y < this->to.y";
    __line = 0x62;
  }
  else if ((y <= dVar7) || (dVar1 <= y)) {
    __assertion = "y > this->from.y && y < this->to.y";
    __line = 99;
  }
  else {
    dVar2 = (this->from).x;
    dVar8 = (this->to).x;
    FloatPoint::FloatPoint(&local_30,(y - dVar7) * ((dVar8 - dVar2) / (dVar1 - dVar7)) + dVar2,y);
    (this->to).x = local_30.x;
    (this->to).y = local_30.y;
    dVar7 = (this->to).x;
    dVar2 = (this->to).y;
    if (this->direction == -1) {
      uVar4 = SUB84(dVar8,0);
      uVar5 = (undefined4)((ulong)dVar8 >> 0x20);
      dVar6 = dVar1;
      dVar8 = dVar2;
    }
    else {
      uVar4 = SUB84(dVar7,0);
      uVar5 = (undefined4)((ulong)dVar7 >> 0x20);
      dVar6 = dVar2;
      dVar7 = dVar8;
      dVar8 = dVar1;
    }
    dVar3 = (this->from).y;
    if ((dVar3 != dVar6) || (NAN(dVar3) || NAN(dVar6))) {
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        to.y = dVar8;
        to.x = dVar7;
        from.x._4_4_ = uVar5;
        from.x._0_4_ = uVar4;
        from.y = dVar6;
        Segment(__return_storage_ptr__,from,to,(uint)(long)this->id,this->realSlope);
        return __return_storage_ptr__;
      }
      __assertion = "newPoint.y != to.y";
      __line = 0x70;
    }
    else {
      __assertion = "this->from.y != newPoint.y";
      __line = 0x6f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                ,__line,"const Segment gepard::Segment::splitSegment(const Float)");
}

Assistant:

const Segment Segment::splitSegment(const Float y)
{
    GD_ASSERT(this->from.y < this->to.y);
    GD_ASSERT(y > this->from.y && y < this->to.y);

    const Float x = this->slopeInv() * (y - this->from.y) + this->from.x;
    FloatPoint to = this->to;
    this->to = FloatPoint(x, y);
    FloatPoint newPoint = this->to;

    if (this->direction == Negative) {
        newPoint = to;
        to = this->to;
    }

    GD_ASSERT(this->from.y != newPoint.y);
    GD_ASSERT(newPoint.y != to.y);

    return Segment(newPoint, to, this->id, this->realSlope);
}